

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Parser::_err<c4::basic_substring<char_const>>
          (Parser *this,csubstr fmt,basic_substring<const_char> *args)

{
  code *pcVar1;
  long in_RDI;
  size_t len;
  anon_class_8_1_72ac95b1 dumpfn;
  _SubstrWriter writer;
  char errmsg [1024];
  ulong local_4b0;
  undefined1 local_4a0 [40];
  ulong local_478;
  _SubstrWriter *local_460;
  _SubstrWriter *local_458;
  substr local_450;
  _SubstrWriter local_440;
  char local_428 [224];
  anon_class_8_1_72ac95b1 *in_stack_fffffffffffffcb8;
  Parser *in_stack_fffffffffffffcc0;
  basic_substring<const_char> *in_stack_fffffffffffffcd0;
  csubstr in_stack_fffffffffffffcd8;
  anon_class_8_1_72ac95b1 in_stack_fffffffffffffce8;
  
  basic_substring<char>::basic_substring<1024ul>(&local_450,(char (*) [1024])local_428);
  detail::_SubstrWriter::_SubstrWriter(&local_440,local_450,0);
  local_460 = &local_440;
  local_458 = local_460;
  (anonymous_namespace)::
  _parse_dump<c4::yml::Parser::_err<c4::basic_substring<char_const>>(c4::basic_substring<char_const>,c4::basic_substring<char_const>const&restrict)const::_lambda(c4::basic_substring<char_const>)_1_,c4::basic_substring<char_const>const&>
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  detail::_SubstrWriter::append(&local_440,'\n');
  _fmt_msg<c4::yml::Parser::_err<c4::basic_substring<char_const>>(c4::basic_substring<char_const>,c4::basic_substring<char_const>const&restrict)const::_lambda(c4::basic_substring<char_const>)_1_&>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  if (local_440.pos < 0x400) {
    local_4b0 = local_440.pos;
  }
  else {
    local_4b0 = 0x400;
  }
  local_478 = local_4b0;
  pcVar1 = *(code **)(*(long *)(in_RDI + 0x30) + 0x58);
  memcpy(local_4a0,(void *)(*(long *)(in_RDI + 0x9f0) + 0x30),0x28);
  (*pcVar1)(local_428,local_4b0,*(undefined8 *)(*(long *)(in_RDI + 0x30) + 0x40));
  return;
}

Assistant:

void Parser::_err(csubstr fmt, Args const& C4_RESTRICT ...args) const
{
    char errmsg[RYML_ERRMSG_SIZE];
    detail::_SubstrWriter writer(errmsg);
    auto dumpfn = [&writer](csubstr s){ writer.append(s); };
    _parse_dump(dumpfn, fmt, args...);
    writer.append('\n');
    _fmt_msg(dumpfn);
    size_t len = writer.pos < RYML_ERRMSG_SIZE ? writer.pos : RYML_ERRMSG_SIZE;
    m_tree->m_callbacks.m_error(errmsg, len, m_state->pos, m_tree->m_callbacks.m_user_data);
}